

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

string * __thiscall
leveldb::DBTest::AllEntriesFor_abi_cxx11_
          (string *__return_storage_ptr__,DBTest *this,Slice *user_key)

{
  Comparator *pCVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  DBImpl *this_00;
  ulong uVar5;
  Slice SVar6;
  Slice local_f8;
  string local_e8;
  Slice local_c8;
  undefined1 local_b8 [8];
  ParsedInternalKey ikey;
  bool first;
  string local_88;
  Status local_68;
  undefined1 local_59;
  Slice local_58;
  undefined1 local_48 [8];
  InternalKey target;
  Iterator *iter;
  Slice *user_key_local;
  DBTest *this_local;
  string *result;
  
  this_00 = dbfull(this);
  target.rep_.field_2._8_8_ = DBImpl::TEST_NewInternalIterator(this_00);
  InternalKey::InternalKey((InternalKey *)local_48,user_key,0xffffffffffffff,kTypeValue);
  uVar2 = target.rep_.field_2._8_8_;
  local_58 = InternalKey::Encode((InternalKey *)local_48);
  (**(code **)(*(long *)uVar2 + 0x28))(uVar2,&local_58);
  local_59 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  (**(code **)(*(long *)target.rep_.field_2._8_8_ + 0x50))(&local_68);
  bVar3 = Status::ok(&local_68);
  Status::~Status(&local_68);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[ ");
    ikey._31_1_ = 1;
    while( true ) {
      uVar5 = (**(code **)(*(long *)target.rep_.field_2._8_8_ + 0x10))();
      if ((uVar5 & 1) == 0) break;
      ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_b8);
      SVar6 = (Slice)(**(code **)(*(long *)target.rep_.field_2._8_8_ + 0x40))();
      local_c8 = SVar6;
      bVar3 = ParseInternalKey(&local_c8,(ParsedInternalKey *)local_b8);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        pCVar1 = (this->last_options_).comparator;
        iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,local_b8,user_key);
        if (iVar4 != 0) break;
        if ((ikey._31_1_ & 1) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
        ikey._31_1_ = 0;
        if ((int)ikey.sequence == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"DEL");
        }
        else if ((int)ikey.sequence == 1) {
          SVar6 = (Slice)(**(code **)(*(long *)target.rep_.field_2._8_8_ + 0x48))();
          local_f8 = SVar6;
          Slice::ToString_abi_cxx11_(&local_e8,&local_f8);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"CORRUPTED");
      }
      (**(code **)(*(long *)target.rep_.field_2._8_8_ + 0x30))();
    }
    if ((ikey._31_1_ & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  }
  else {
    (**(code **)(*(long *)target.rep_.field_2._8_8_ + 0x50))(&stack0xffffffffffffff70);
    Status::ToString_abi_cxx11_(&local_88,(Status *)&stack0xffffffffffffff70);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    Status::~Status((Status *)&stack0xffffffffffffff70);
  }
  if (target.rep_.field_2._8_8_ != 0) {
    (**(code **)(*(long *)target.rep_.field_2._8_8_ + 8))();
  }
  local_59 = 1;
  InternalKey::~InternalKey((InternalKey *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string AllEntriesFor(const Slice& user_key) {
    Iterator* iter = dbfull()->TEST_NewInternalIterator();
    InternalKey target(user_key, kMaxSequenceNumber, kTypeValue);
    iter->Seek(target.Encode());
    std::string result;
    if (!iter->status().ok()) {
      result = iter->status().ToString();
    } else {
      result = "[ ";
      bool first = true;
      while (iter->Valid()) {
        ParsedInternalKey ikey;
        if (!ParseInternalKey(iter->key(), &ikey)) {
          result += "CORRUPTED";
        } else {
          if (last_options_.comparator->Compare(ikey.user_key, user_key) != 0) {
            break;
          }
          if (!first) {
            result += ", ";
          }
          first = false;
          switch (ikey.type) {
            case kTypeValue:
              result += iter->value().ToString();
              break;
            case kTypeDeletion:
              result += "DEL";
              break;
          }
        }
        iter->Next();
      }
      if (!first) {
        result += " ";
      }
      result += "]";
    }
    delete iter;
    return result;
  }